

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O0

size_t getEnd(size_t count,size_t total,size_t id)

{
  size_t end_index;
  size_t remain;
  size_t gap;
  size_t id_local;
  size_t total_local;
  size_t count_local;
  
  end_index = (id + 1) * (count / total);
  if (id == total - 1) {
    end_index = count % total + end_index;
  }
  return end_index;
}

Assistant:

inline size_t getEnd(size_t count, size_t total, size_t id) {
  size_t gap = count / total;
  size_t remain = count % total;
  size_t end_index = (id+1) * gap;
  if (id == total-1) {
    end_index += remain;
  }
  return end_index;
}